

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O1

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,Options *options)

{
  once_flag *__once;
  bool bVar1;
  ObjectiveCType OVar2;
  MapFieldGenerator *this;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  __once = *(once_flag **)(field + 0x30);
  if (*(int *)(field + 0x3c) == 3) {
    if (__once != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,&local_28,&local_30);
    }
    OVar2 = GetObjectiveCType(*(Type *)(field + 0x38));
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      this = (MapFieldGenerator *)operator_new(0x40);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_28 = FieldDescriptor::TypeOnceInit;
        local_30 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_28,&local_30);
      }
      if (*(int *)(field + 0x38) == 0xb) {
        bVar1 = FieldDescriptor::is_map_message_type(field);
        if (bVar1) {
          this = (MapFieldGenerator *)operator_new(0x48);
          MapFieldGenerator::MapFieldGenerator(this,field,options);
          goto LAB_002e56fb;
        }
      }
      this = (MapFieldGenerator *)operator_new(0x40);
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                ((RepeatedMessageFieldGenerator *)this,field,options);
    }
    else {
      this = (MapFieldGenerator *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,options);
    }
  }
  else {
    if (__once != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,&local_28,&local_30);
    }
    OVar2 = GetObjectiveCType(*(Type *)(field + 0x38));
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      this = (MapFieldGenerator *)operator_new(0x40);
      EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      this = (MapFieldGenerator *)operator_new(0x40);
      MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this,field,options);
    }
    else {
      bVar1 = IsReferenceType(field);
      this = (MapFieldGenerator *)operator_new(0x40);
      if (bVar1) {
        PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                  ((PrimitiveObjFieldGenerator *)this,field,options);
      }
      else {
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)this,field,options);
      }
    }
  }
LAB_002e56fb:
  (*(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
    super_FieldGenerator._vptr_FieldGenerator[0xb])(this);
  return (FieldGenerator *)this;
}

Assistant:

FieldGenerator* FieldGenerator::Make(const FieldDescriptor* field,
                                     const Options& options) {
  FieldGenerator* result = NULL;
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          result = new MapFieldGenerator(field, options);
        } else {
          result = new RepeatedMessageFieldGenerator(field, options);
        }
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new RepeatedEnumFieldGenerator(field, options);
        break;
      default:
        result = new RepeatedPrimitiveFieldGenerator(field, options);
        break;
    }
  } else {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        result = new MessageFieldGenerator(field, options);
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new EnumFieldGenerator(field, options);
        break;
      default:
        if (IsReferenceType(field)) {
          result = new PrimitiveObjFieldGenerator(field, options);
        } else {
          result = new PrimitiveFieldGenerator(field, options);
        }
        break;
    }
  }
  result->FinishInitialization();
  return result;
}